

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O2

Am_Marshall_Method __thiscall
OpenAmulet::Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_>::GetAt
          (Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_> *this,
          unsigned_short *aKey)

{
  Am_Marshall_Method *pAVar1;
  const_iterator cVar2;
  _Base_ptr *pp_Var3;
  Am_Marshall_Method AVar4;
  
  cVar2 = std::
          _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_Am_Marshall_Method>,_std::_Select1st<std::pair<const_unsigned_short,_Am_Marshall_Method>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Marshall_Method>_>_>
          ::find((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_Am_Marshall_Method>,_std::_Select1st<std::pair<const_unsigned_short,_Am_Marshall_Method>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Am_Marshall_Method>_>_>
                  *)this,aKey);
  pp_Var3 = (_Base_ptr *)&(this->mDefaultReturn).Call;
  pAVar1 = &this->mDefaultReturn;
  if ((_Rb_tree_header *)cVar2._M_node != &(this->mMap)._M_t._M_impl.super__Rb_tree_header) {
    pp_Var3 = &cVar2._M_node[1]._M_left;
    pAVar1 = (Am_Marshall_Method *)&cVar2._M_node[1]._M_parent;
  }
  AVar4.Call = (Am_Marshall_Method_Type *)*pp_Var3;
  AVar4.from_wrapper = (Am_Method_Wrapper *)pAVar1->from_wrapper;
  return AVar4;
}

Assistant:

Item GetAt(const Key &aKey) const
  {
#ifdef DEBUG
    // This is for debugging propose only. If you want to look at the
    // map change the dumpMap value to true within your debugger
    bool dumpMap(false);
    if (dumpMap == true) {
      Dump();
    }
#endif

    // do we have an item with aKey?
    typename std::map<Key, Item, Compare>::const_iterator it = mMap.find(aKey);
    if (it != mMap.end()) {
      return ((*it).second);
    } else {
      // the key wasn't found so return the default object value
      return (mDefaultReturn);
    }
  }